

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::
FunctionMocker<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
::PrintTriedExpectationsLocked
          (FunctionMocker<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
           *this,ArgumentTuple *args,ostream *why)

{
  TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
  *pTVar1;
  ostream *poVar2;
  __shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2> *this_00;
  TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
  *this_01;
  char *pcVar3;
  TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
  *expectation;
  size_t i;
  size_t count;
  ostream *why_local;
  ArgumentTuple *args_local;
  FunctionMocker<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
  *this_local;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  pTVar1 = (TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
            *)std::
              vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
              ::size(&(this->super_UntypedFunctionMockerBase).untyped_expectations_);
  poVar2 = std::operator<<(why,"Google Mock tried the following ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ulong)pTVar1);
  poVar2 = std::operator<<(poVar2," ");
  pcVar3 = "expectations, but none matched";
  if (pTVar1 == (TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
                 *)0x1) {
    pcVar3 = "expectation, but it didn\'t match";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,":\n");
  for (expectation = (TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
                      *)0x0; expectation < pTVar1;
      expectation = (TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
                     *)((long)&(expectation->super_ExpectationBase)._vptr_ExpectationBase + 1)) {
    this_00 = &std::
               vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
               ::operator[](&(this->super_UntypedFunctionMockerBase).untyped_expectations_,
                            (size_type)expectation)->
               super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>;
    this_01 = (TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
               *)std::__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>::
                 get(this_00);
    std::operator<<(why,"\n");
    ExpectationBase::DescribeLocationTo((ExpectationBase *)this_01,why);
    if ((TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
         *)0x1 < pTVar1) {
      poVar2 = std::operator<<(why,"tried expectation #");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ulong)expectation);
      std::operator<<(poVar2,": ");
    }
    pcVar3 = ExpectationBase::source_text((ExpectationBase *)this_01);
    poVar2 = std::operator<<(why,pcVar3);
    std::operator<<(poVar2,"...\n");
    TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
    ::ExplainMatchResultTo(this_01,args,why);
    ExpectationBase::DescribeCallCountTo((ExpectationBase *)this_01,why);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const size_t count = untyped_expectations_.size();
    *why << "Google Mock tried the following " << count << " "
         << (count == 1 ? "expectation, but it didn't match" :
             "expectations, but none matched")
         << ":\n";
    for (size_t i = 0; i < count; i++) {
      TypedExpectation<F>* const expectation =
          static_cast<TypedExpectation<F>*>(untyped_expectations_[i].get());
      *why << "\n";
      expectation->DescribeLocationTo(why);
      if (count > 1) {
        *why << "tried expectation #" << i << ": ";
      }
      *why << expectation->source_text() << "...\n";
      expectation->ExplainMatchResultTo(args, why);
      expectation->DescribeCallCountTo(why);
    }
  }